

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SRGBTestCase::deleteShaderPrograms(SRGBTestCase *this)

{
  SRGBTestProgram *this_00;
  size_type sVar1;
  reference ppSVar2;
  ulong local_18;
  size_t idx;
  SRGBTestCase *this_local;
  
  local_18 = 0;
  while( true ) {
    sVar1 = std::
            vector<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
            ::size(&this->m_shaderProgramList);
    if (sVar1 <= local_18) break;
    ppSVar2 = std::
              vector<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
              ::operator[](&this->m_shaderProgramList,local_18);
    this_00 = *ppSVar2;
    if (this_00 != (SRGBTestProgram *)0x0) {
      SRGBTestProgram::~SRGBTestProgram(this_00);
      operator_delete(this_00,0xf8);
    }
    local_18 = local_18 + 1;
  }
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
  ::clear(&this->m_shaderProgramList);
  return;
}

Assistant:

void SRGBTestCase::deleteShaderPrograms (void)
{
	for (std::size_t idx = 0; idx < m_shaderProgramList.size(); idx++)
	{
		delete m_shaderProgramList[idx];
	}
	m_shaderProgramList.clear();
}